

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

block_state deflate_stored(deflate_state *s,int flush)

{
  uInt uVar1;
  ulong uVar2;
  Bytef *local_60;
  Bytef *local_50;
  Bytef *local_40;
  ulg max_start;
  ulg max_block_size;
  int flush_local;
  deflate_state *s_local;
  
  max_start = 0xffff;
  if (s->pending_buf_size - 5 < 0xffff) {
    max_start = s->pending_buf_size - 5;
  }
  do {
    if (s->lookahead < 2) {
      fill_window(s);
      if ((s->lookahead == 0) && (flush == 0)) {
        return need_more;
      }
      if (s->lookahead == 0) {
        if (s->block_start < 0) {
          local_60 = (Bytef *)0x0;
        }
        else {
          local_60 = s->window + (s->block_start & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)local_60,(ulong)s->strstart - s->block_start,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          if (flush != 4) {
            return need_more;
          }
          return finish_started;
        }
        if (flush != 4) {
          return block_done;
        }
        return finish_done;
      }
    }
    s->strstart = s->lookahead + s->strstart;
    s->lookahead = 0;
    uVar2 = s->block_start + max_start;
    if ((s->strstart == 0) || (uVar2 <= s->strstart)) {
      uVar1 = (uInt)uVar2;
      s->lookahead = s->strstart - uVar1;
      s->strstart = uVar1;
      if (s->block_start < 0) {
        local_40 = (Bytef *)0x0;
      }
      else {
        local_40 = s->window + (s->block_start & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)local_40,(ulong)s->strstart - s->block_start,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
    if (s->w_size - 0x106 <= s->strstart - (int)s->block_start) {
      if (s->block_start < 0) {
        local_50 = (Bytef *)0x0;
      }
      else {
        local_50 = s->window + (s->block_start & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)local_50,(ulong)s->strstart - s->block_start,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_stored(deflate_state *s, int flush)
{
    /* Stored blocks are limited to 0xffff bytes, pending_buf is limited
     * to pending_buf_size, and each stored block has a 5 byte header:
     */
    ulg max_block_size = 0xffff;
    ulg max_start;

    if (max_block_size > s->pending_buf_size - 5) {
        max_block_size = s->pending_buf_size - 5;
    }

    /* Copy as much as possible from input to output: */
    for (;;) {
        /* Fill the window as much as possible: */
        if (s->lookahead <= 1) {

            Assert(s->strstart < s->w_size+MAX_DIST(s) ||
                   s->block_start >= (long)s->w_size, "slide too late");

            fill_window(s);
            if (s->lookahead == 0 && flush == Z_NO_FLUSH) return need_more;

            if (s->lookahead == 0) break; /* flush the current block */
        }
        Assert(s->block_start >= 0L, "block gone");

        s->strstart += s->lookahead;
        s->lookahead = 0;

        /* Emit a stored block if pending_buf will be full: */
        max_start = s->block_start + max_block_size;
        if (s->strstart == 0 || (ulg)s->strstart >= max_start) {
            /* strstart == 0 is possible when wraparound on 16-bit machine */
            s->lookahead = (uInt)(s->strstart - max_start);
            s->strstart = (uInt)max_start;
            FLUSH_BLOCK(s, 0);
        }
        /* Flush if we may have to slide, otherwise block_start may become
         * negative and the data will be gone:
         */
        if (s->strstart - (uInt)s->block_start >= MAX_DIST(s)) {
            FLUSH_BLOCK(s, 0);
        }
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}